

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TtHieManStop(Abc_TtHieMan_t *p)

{
  int local_14;
  int i;
  Abc_TtHieMan_t *p_local;
  
  for (local_14 = 0; local_14 <= p->nLastLevel; local_14 = local_14 + 1) {
    Vec_MemHashFree(p->vTtMem[local_14]);
    Vec_MemFreeP(p->vTtMem + local_14);
    Vec_IntFree(p->vRepres[local_14]);
  }
  Vec_IntFree(p->vPhase);
  if (p != (Abc_TtHieMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Abc_TtHieManStop(Abc_TtHieMan_t * p)
{
    int i;
    for (i = 0; i <= p->nLastLevel; i++)
    {
        Vec_MemHashFree(p->vTtMem[i]);
        Vec_MemFreeP(&p->vTtMem[i]);
        Vec_IntFree(p->vRepres[i]);
    }
    Vec_IntFree( p->vPhase );
    ABC_FREE(p);
}